

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O1

bool __thiscall
ByteCodeGenerator::CanStackNestedFunc(ByteCodeGenerator *this,FuncInfo *funcInfo,bool trace)

{
  Utf8SourceInfo *pUVar1;
  ParseableFunctionInfo *pPVar2;
  NestedArray *pNVar3;
  code *pcVar4;
  bool bVar5;
  uint uVar6;
  LocalFunctionId LVar7;
  int iVar8;
  undefined4 *puVar9;
  undefined4 extraout_var;
  char16 *pcVar11;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  char16_t *form;
  wchar local_88 [4];
  char16 debugStringBuffer [42];
  undefined8 uVar10;
  
  bVar5 = FuncInfo::IsGlobalFunction(funcInfo);
  if (bVar5) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                       ,0x754,"(!funcInfo->IsGlobalFunction())","!funcInfo->IsGlobalFunction()");
    if (!bVar5) goto LAB_00832193;
    *puVar9 = 0;
  }
  if (((funcInfo->field_0xb5 & 0x20) != 0) ||
     (((pUVar1 = this->m_utf8SourceInfo, (pUVar1->debugModeSource).ptr != (uchar *)0x0 ||
       ((pUVar1->field_0xa8 & 0x20) != 0)) && ((pUVar1->field_0xa8 & 0x40) != 0)))) {
    return false;
  }
  pPVar2 = funcInfo->byteCodeFunction;
  if ((pPVar2->super_FunctionProxy).functionInfo.ptr == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                       ,0x50d,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar5) goto LAB_00832193;
    *puVar9 = 0;
  }
  if ((ParseableFunctionInfo *)
      (((pPVar2->super_FunctionProxy).functionInfo.ptr)->functionBodyImpl).ptr != pPVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                       ,0x50e,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                       "GetFunctionInfo()->GetFunctionProxy() == this");
    if (!bVar5) goto LAB_00832193;
    *puVar9 = 0;
  }
  if ((((pPVar2->super_FunctionProxy).functionInfo.ptr)->attributes & (Async|Generator)) != None) {
    return false;
  }
  pPVar2 = funcInfo->byteCodeFunction;
  if ((pPVar2->super_FunctionProxy).functionInfo.ptr == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                       ,0x57d,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar5) goto LAB_00832193;
    *puVar9 = 0;
  }
  if ((ParseableFunctionInfo *)
      (((pPVar2->super_FunctionProxy).functionInfo.ptr)->functionBodyImpl).ptr != pPVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                       ,0x57e,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                       "GetFunctionInfo()->GetFunctionProxy() == this");
    if (!bVar5) {
LAB_00832193:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar9 = 0;
  }
  if ((((pPVar2->super_FunctionProxy).functionInfo.ptr)->attributes & Module) != None) {
    return false;
  }
  bVar5 = Js::ScriptContext::ExceedsStackNestedFuncCount(funcInfo->root->nestedCount);
  if (bVar5) {
    return false;
  }
  if ((*(uint *)&funcInfo->field_0xb4 & 6) == 0) {
    if ((((funcInfo->bodyScope->field_0x44 & 2) == 0) &&
        ((funcInfo->paramScope->field_0x44 & 2) == 0)) &&
       ((funcInfo->funcExprScope == (Scope *)0x0 || ((funcInfo->funcExprScope->field_0x44 & 2) == 0)
        ))) {
      if ((short)*(uint *)&funcInfo->field_0xb4 < 0) {
        if (trace) {
          pNVar3 = (funcInfo->byteCodeFunction->nestedArray).ptr;
          if ((pNVar3 != (NestedArray *)0x0) && (pNVar3->nestedCount != 0)) {
            uVar6 = Js::FunctionProxy::GetSourceContextId
                              (&funcInfo->byteCodeFunction->super_FunctionProxy);
            LVar7 = Js::FunctionProxy::GetLocalFunctionId
                              (&funcInfo->byteCodeFunction->super_FunctionProxy);
            bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_015d3490,StackFuncPhase,uVar6,LVar7);
            if (bVar5) {
              iVar8 = (*(funcInfo->byteCodeFunction->super_FunctionProxy).super_FinalizableObject.
                        super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])();
              pcVar11 = Js::FunctionProxy::GetDebugNumberSet
                                  (&funcInfo->byteCodeFunction->super_FunctionProxy,
                                   (wchar (*) [42])local_88);
              Output::Print(L"DoStackNestedFunc: %s (function %s)\n",CONCAT44(extraout_var_02,iVar8)
                            ,pcVar11);
              Output::Flush();
            }
          }
        }
        uVar6 = Js::FunctionProxy::GetSourceContextId
                          (&funcInfo->byteCodeFunction->super_FunctionProxy);
        LVar7 = Js::FunctionProxy::GetLocalFunctionId
                          (&funcInfo->byteCodeFunction->super_FunctionProxy);
        bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_015bbe90,StackFuncPhase,uVar6,LVar7);
        return !bVar5;
      }
      if (!trace) {
        return false;
      }
      uVar6 = Js::FunctionProxy::GetSourceContextId
                        (&funcInfo->byteCodeFunction->super_FunctionProxy);
      LVar7 = Js::FunctionProxy::GetLocalFunctionId
                        (&funcInfo->byteCodeFunction->super_FunctionProxy);
      bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_015d3490,StackFuncPhase,uVar6,LVar7);
      if (!bVar5) {
        return false;
      }
      iVar8 = (*(funcInfo->byteCodeFunction->super_FunctionProxy).super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])();
      Output::Print(L"CanStackNestedFunc: %s (Split Scope)\n",CONCAT44(extraout_var_00,iVar8));
      goto LAB_008320ae;
    }
    if (!trace) {
      return false;
    }
    uVar6 = Js::FunctionProxy::GetSourceContextId(&funcInfo->byteCodeFunction->super_FunctionProxy);
    LVar7 = Js::FunctionProxy::GetLocalFunctionId(&funcInfo->byteCodeFunction->super_FunctionProxy);
    bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_015d3490,StackFuncPhase,uVar6,LVar7);
    if (!bVar5) {
      return false;
    }
    iVar8 = (*(funcInfo->byteCodeFunction->super_FunctionProxy).super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])();
    uVar10 = CONCAT44(extraout_var_01,iVar8);
    pcVar11 = Js::FunctionProxy::GetDebugNumberSet
                        (&funcInfo->byteCodeFunction->super_FunctionProxy,(wchar (*) [42])local_88);
    form = L"HasMaybeEscapedNestedFunc (ObjectScope): %s (function %s)\n";
  }
  else {
    if (!trace) {
      return false;
    }
    uVar6 = Js::FunctionProxy::GetSourceContextId(&funcInfo->byteCodeFunction->super_FunctionProxy);
    LVar7 = Js::FunctionProxy::GetLocalFunctionId(&funcInfo->byteCodeFunction->super_FunctionProxy);
    bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_015d3490,StackFuncPhase,uVar6,LVar7);
    if (!bVar5) {
      return false;
    }
    iVar8 = (*(funcInfo->byteCodeFunction->super_FunctionProxy).super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[7])();
    uVar10 = CONCAT44(extraout_var,iVar8);
    pcVar11 = Js::FunctionProxy::GetDebugNumberSet
                        (&funcInfo->byteCodeFunction->super_FunctionProxy,(wchar (*) [42])local_88);
    form = L"HasMaybeEscapedNestedFunc (Eval): %s (function %s)\n";
  }
  Output::Print(form,uVar10,pcVar11);
LAB_008320ae:
  Output::Flush();
  return false;
}

Assistant:

bool ByteCodeGenerator::CanStackNestedFunc(FuncInfo * funcInfo, bool trace)
{
#if ENABLE_DEBUG_CONFIG_OPTIONS
    char16 debugStringBuffer[MAX_FUNCTION_BODY_DEBUG_STRING_SIZE];
#endif
    Assert(!funcInfo->IsGlobalFunction());
    bool const doStackNestedFunc = !funcInfo->HasMaybeEscapedNestedFunc() && !IsInDebugMode()
        && !funcInfo->byteCodeFunction->IsCoroutine()
        && !funcInfo->byteCodeFunction->IsModule()
        && !Js::ScriptContext::ExceedsStackNestedFuncCount(funcInfo->root->nestedCount);
    if (!doStackNestedFunc)
    {
        return false;
    }

    bool callsEval = funcInfo->GetCallsEval() || funcInfo->GetChildCallsEval();
    if (callsEval)
    {
        if (trace)
        {
            PHASE_PRINT_TESTTRACE(Js::StackFuncPhase, funcInfo->byteCodeFunction,
                _u("HasMaybeEscapedNestedFunc (Eval): %s (function %s)\n"),
                funcInfo->byteCodeFunction->GetDisplayName(),
                funcInfo->byteCodeFunction->GetDebugNumberSet(debugStringBuffer));
        }
        return false;
    }

    if (funcInfo->GetBodyScope()->GetIsObject() || funcInfo->GetParamScope()->GetIsObject() || (funcInfo->GetFuncExprScope() && funcInfo->GetFuncExprScope()->GetIsObject()))
    {
        if (trace)
        {
            PHASE_PRINT_TESTTRACE(Js::StackFuncPhase, funcInfo->byteCodeFunction,
                _u("HasMaybeEscapedNestedFunc (ObjectScope): %s (function %s)\n"),
                funcInfo->byteCodeFunction->GetDisplayName(),
                funcInfo->byteCodeFunction->GetDebugNumberSet(debugStringBuffer));
        }
        return false;
    }

    if (!funcInfo->IsBodyAndParamScopeMerged())
    {
        if (trace)
        {
            PHASE_PRINT_TESTTRACE(Js::StackFuncPhase, funcInfo->byteCodeFunction,
                _u("CanStackNestedFunc: %s (Split Scope)\n"),
                funcInfo->byteCodeFunction->GetDisplayName());
        }
        return false;
    }

    if (trace && funcInfo->byteCodeFunction->GetNestedCount())
    {
        // Only print functions that actually have nested functions, although we will still mark
        // functions that don't have nested child functions as DoStackNestedFunc.
        PHASE_PRINT_TESTTRACE(Js::StackFuncPhase, funcInfo->byteCodeFunction,
            _u("DoStackNestedFunc: %s (function %s)\n"),
            funcInfo->byteCodeFunction->GetDisplayName(),
            funcInfo->byteCodeFunction->GetDebugNumberSet(debugStringBuffer));
    }

    return !PHASE_OFF(Js::StackFuncPhase, funcInfo->byteCodeFunction);
}